

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

void __thiscall libcellml::XmlDoc::parseMathML(XmlDoc *this,string *input)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  xmlDocPtr pxVar5;
  xmlDtdPtr dtd;
  xmlParserInputBufferPtr buf;
  xmlParserCtxtPtr context;
  undefined4 local_1c;
  string *psStack_18;
  int sizeMathmlDTDUncompressed;
  string *input_local;
  XmlDoc *this_local;
  
  local_1c = 0x5f8a8;
  psStack_18 = input;
  input_local = (string *)this;
  if ((parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_),
     iVar1 != 0)) {
    std::__cxx11::string::string
              ((string *)&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    decompressMathMLDTD_abi_cxx11_();
    std::__cxx11::string::operator=
              ((string *)&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_,
               (string *)&context);
    std::__cxx11::string::~string((string *)&context);
  }
  xmlInitParser();
  lVar3 = xmlNewParserCtxt();
  *(XmlDoc **)(lVar3 + 0x1a8) = this;
  xmlSetStructuredErrorFunc(lVar3,structuredErrorCallback);
  uVar4 = std::__cxx11::string::c_str();
  pxVar5 = (xmlDocPtr)xmlCtxtReadDoc(lVar3,uVar4,"/",0,0);
  this->mPimpl->mXmlDocPtr = pxVar5;
  uVar4 = std::__cxx11::string::c_str();
  uVar4 = xmlParserInputBufferCreateMem(uVar4,local_1c,0x16);
  uVar4 = xmlIOParseDTD(0,uVar4,0x16);
  xmlValidateDtd(lVar3 + 0xa0,this->mPimpl->mXmlDocPtr,uVar4);
  xmlFreeDtd(uVar4);
  xmlFreeParserCtxt(lVar3);
  xmlSetStructuredErrorFunc(0);
  xmlCleanupParser();
  return;
}

Assistant:

void XmlDoc::parseMathML(const std::string &input)
{
    // Decompress the MathML DTD.
    int sizeMathmlDTDUncompressed = MATHML_DTD_LEN;

    static std::string mathMLDTD;

    if (mathMLDTD.empty()) {
        mathMLDTD = decompressMathMLDTD();
    }

    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    context->_private = reinterpret_cast<void *>(this);
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    mPimpl->mXmlDocPtr = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(input.c_str()), "/", nullptr, 0);
    xmlParserInputBufferPtr buf = xmlParserInputBufferCreateMem(reinterpret_cast<const char *>(mathMLDTD.c_str()), sizeMathmlDTDUncompressed, XML_CHAR_ENCODING_ASCII);
    xmlDtdPtr dtd = xmlIOParseDTD(nullptr, buf, XML_CHAR_ENCODING_ASCII);
    xmlValidateDtd(&(context->vctxt), mPimpl->mXmlDocPtr, dtd);

    xmlFreeDtd(dtd);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}